

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeCellSizeCheck(MemPage *pPage)

{
  u8 uVar1;
  ushort uVar2;
  ushort uVar3;
  u32 uVar4;
  u8 *puVar5;
  ushort uVar6;
  u16 uVar7;
  int iVar8;
  ulong uVar9;
  
  uVar2 = pPage->cellOffset;
  uVar3 = pPage->nCell;
  uVar1 = pPage->leaf;
  uVar4 = pPage->pBt->usableSize;
  puVar5 = pPage->aData;
  uVar9 = 0;
  do {
    if (pPage->nCell <= uVar9) {
      return 0;
    }
    uVar6 = *(ushort *)(puVar5 + uVar9 * 2 + (ulong)uVar2);
    uVar6 = uVar6 << 8 | uVar6 >> 8;
    iVar8 = 0xfe7c;
    if (((uint)uVar6 < (uint)uVar2 + (uint)uVar3 * 2) ||
       ((int)((uVar4 - (uVar1 == '\0')) + -4) < (int)(uint)uVar6)) goto LAB_001347b5;
    uVar7 = (*pPage->xCellSize)(pPage,puVar5 + uVar6);
    uVar9 = uVar9 + 1;
  } while ((int)((uint)uVar7 + (uint)uVar6) <= (int)uVar4);
  iVar8 = 0xfe81;
LAB_001347b5:
  iVar8 = sqlite3CorruptError(iVar8);
  return iVar8;
}

Assistant:

static SQLITE_NOINLINE int btreeCellSizeCheck(MemPage *pPage){
  int iCellFirst;    /* First allowable cell or freeblock offset */
  int iCellLast;     /* Last possible cell or freeblock offset */
  int i;             /* Index into the cell pointer array */
  int sz;            /* Size of a cell */
  int pc;            /* Address of a freeblock within pPage->aData[] */
  u8 *data;          /* Equal to pPage->aData */
  int usableSize;    /* Maximum usable space on the page */
  int cellOffset;    /* Start of cell content area */

  iCellFirst = pPage->cellOffset + 2*pPage->nCell;
  usableSize = pPage->pBt->usableSize;
  iCellLast = usableSize - 4;
  data = pPage->aData;
  cellOffset = pPage->cellOffset;
  if( !pPage->leaf ) iCellLast--;
  for(i=0; i<pPage->nCell; i++){
    pc = get2byteAligned(&data[cellOffset+i*2]);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    sz = pPage->xCellSize(pPage, &data[pc]);
    testcase( pc+sz==usableSize );
    if( pc+sz>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }
  return SQLITE_OK;
}